

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O0

vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> * __thiscall
fasttext::Meter::scoreVsTrue(Meter *this,int32_t labelId)

{
  bool bVar1;
  iterator __position;
  iterator __first;
  int in_EDX;
  vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *in_RDI;
  vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *labelScoreVsTrue;
  value_type *k;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
  *__range2;
  vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *ret;
  unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
  *in_stack_ffffffffffffff38;
  unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
  *in_stack_ffffffffffffff40;
  __normal_iterator<std::pair<float,_float>_*,_std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
  in_stack_ffffffffffffff48;
  iterator in_stack_ffffffffffffff50;
  vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
  *in_stack_ffffffffffffff80;
  iterator in_stack_ffffffffffffff88;
  _Node_iterator_base<std::pair<const_int,_fasttext::Meter::Metrics>,_false> local_30;
  _Node_iterator_base<std::pair<const_int,_fasttext::Meter::Metrics>,_false>
  in_stack_ffffffffffffffd8;
  vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
  *in_stack_ffffffffffffffe0;
  
  std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::vector
            ((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *)0x1b8255)
  ;
  if (in_EDX == -1) {
    std::
    unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
    ::begin(in_stack_ffffffffffffff38);
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
         ::end(in_stack_ffffffffffffff38);
    while (bVar1 = std::__detail::operator!=
                             ((_Node_iterator_base<std::pair<const_int,_fasttext::Meter::Metrics>,_false>
                               *)&stack0xffffffffffffffd8,&local_30), bVar1) {
      std::__detail::
      _Node_const_iterator<std::pair<const_int,_fasttext::Meter::Metrics>,_false,_false>::operator*
                ((_Node_const_iterator<std::pair<const_int,_fasttext::Meter::Metrics>,_false,_false>
                  *)0x1b82c9);
      std::
      unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
      ::at(in_stack_ffffffffffffff40,(key_type *)in_stack_ffffffffffffff38);
      std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::end
                ((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *)
                 in_stack_ffffffffffffff38);
      __gnu_cxx::
      __normal_iterator<std::pair<float,float>const*,std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>>
      ::__normal_iterator<std::pair<float,float>*>
                ((__normal_iterator<const_std::pair<float,_float>_*,_std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
                  *)in_stack_ffffffffffffff40,
                 (__normal_iterator<std::pair<float,_float>_*,_std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
                  *)in_stack_ffffffffffffff38);
      __position = std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::
                   begin((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                          *)in_stack_ffffffffffffff38);
      __first = std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::end
                          ((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                            *)in_stack_ffffffffffffff38);
      in_stack_ffffffffffffff50 =
           std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>::
           insert<__gnu_cxx::__normal_iterator<std::pair<float,float>*,std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>>,void>
                     (in_stack_ffffffffffffff80,__position._M_current,__first._M_current,
                      in_stack_ffffffffffffff88._M_current);
      in_stack_ffffffffffffff88 = in_stack_ffffffffffffff50;
      std::__detail::
      _Node_const_iterator<std::pair<const_int,_fasttext::Meter::Metrics>,_false,_false>::operator++
                ((_Node_const_iterator<std::pair<const_int,_fasttext::Meter::Metrics>,_false,_false>
                  *)in_stack_ffffffffffffff40);
    }
  }
  else {
    in_stack_ffffffffffffff48._M_current =
         (pair<float,_float> *)
         std::
         unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
         ::count(in_stack_ffffffffffffff40,(key_type *)in_stack_ffffffffffffff38);
    if (in_stack_ffffffffffffff48._M_current != (pair<float,_float> *)0x0) {
      std::
      unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
      ::at(in_stack_ffffffffffffff40,(key_type *)in_stack_ffffffffffffff38);
      std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::operator=
                (in_stack_ffffffffffffffe0,
                 (vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *)
                 in_stack_ffffffffffffffd8._M_cur);
    }
  }
  std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::begin
            ((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *)
             in_stack_ffffffffffffff38);
  std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::end
            ((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *)
             in_stack_ffffffffffffff38);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<float,float>*,std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>>>
            ((__normal_iterator<std::pair<float,_float>_*,_std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
              )in_stack_ffffffffffffff50._M_current,in_stack_ffffffffffffff48);
  return in_RDI;
}

Assistant:

std::vector<std::pair<real, real>> Meter::scoreVsTrue(int32_t labelId) const {
  std::vector<std::pair<real, real>> ret;
  if (labelId == kAllLabels) {
    for (const auto& k : labelMetrics_) {
      auto& labelScoreVsTrue = labelMetrics_.at(k.first).scoreVsTrue;
      ret.insert(ret.end(), labelScoreVsTrue.begin(), labelScoreVsTrue.end());
    }
  } else {
    if (labelMetrics_.count(labelId)) {
      ret = labelMetrics_.at(labelId).scoreVsTrue;
    }
  }
  sort(ret.begin(), ret.end());

  return ret;
}